

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFillBufferTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::FillBufferTestInstance::uploadBuffer
          (FillBufferTestInstance *this,ConstPixelBufferAccess *bufferAccess,Allocation *bufferAlloc
          )

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DeviceInterface *vkd;
  VkDevice device;
  ulong __n;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  iVar1 = (bufferAccess->m_size).m_data[1];
  iVar2 = (bufferAccess->m_size).m_data[0];
  iVar3 = (bufferAccess->m_size).m_data[2];
  iVar4 = tcu::getPixelSize(bufferAccess->m_format);
  __n = (ulong)(uint)(iVar1 * iVar2 * iVar3 * iVar4);
  memcpy(bufferAlloc->m_hostPtr,bufferAccess->m_data,__n);
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(bufferAlloc->m_memory).m_internal,bufferAlloc->m_offset,__n
            );
  return;
}

Assistant:

void FillBufferTestInstance::uploadBuffer (tcu::ConstPixelBufferAccess bufferAccess, const Allocation& bufferAlloc)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const deUint32				bufferSize	= calculateSize(bufferAccess);

	// Write buffer data
	deMemcpy(bufferAlloc.getHostPtr(), bufferAccess.getDataPtr(), bufferSize);
	flushMappedMemoryRange(vk, vkDevice, bufferAlloc.getMemory(), bufferAlloc.getOffset(), bufferSize);
}